

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.cpp
# Opt level: O2

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,mbedtls_cipher_id_t cipher,uchar *key,uint keybits)

{
  int iVar1;
  mbedtls_cipher_info_t *cipher_info;
  ulong uVar2;
  uint64_t (*pauVar3) [2];
  uint64_t (*pauVar4) [2];
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint64_t u64h [2];
  size_t local_30;
  
  iVar1 = -0x14;
  if ((((keybits == 0x80) || (keybits == 0x100)) || (keybits == 0xc0)) &&
     ((cipher_info = mbedtls_cipher_info_from_values(cipher,keybits,MBEDTLS_MODE_ECB),
      cipher_info != (mbedtls_cipher_info_t *)0x0 &&
      ((*(uint *)&cipher_info->field_0x8 & 0x1f) == 0x10)))) {
    mbedtls_cipher_free(&ctx->cipher_ctx);
    iVar1 = mbedtls_cipher_setup(&ctx->cipher_ctx,cipher_info);
    if ((iVar1 == 0) &&
       (iVar1 = mbedtls_cipher_setkey(&ctx->cipher_ctx,key,keybits,MBEDTLS_ENCRYPT), iVar1 == 0)) {
      u64h[0] = 0;
      u64h[1] = 0;
      local_30 = 0;
      iVar1 = mbedtls_cipher_update(&ctx->cipher_ctx,(uchar *)u64h,0x10,(uchar *)u64h,&local_30);
      if (iVar1 == 0) {
        ctx->acceleration = '\0';
        ctx->H[8][0] = u64h[0];
        ctx->H[8][1] = u64h[1];
        ctx->H[0][0] = 0;
        ctx->H[0][1] = 0;
        for (uVar7 = 4; uVar7 != 0; uVar7 = uVar7 >> 1) {
          gcm_gen_table_rightshift(ctx->H[uVar7],ctx->H[uVar7 * 2]);
        }
        for (uVar7 = 8; uVar7 != 0; uVar7 = uVar7 >> 1) {
          uVar5 = ctx->H[uVar7][0];
          uVar2 = ctx->H[uVar7][1];
          ctx->H[uVar7][0] =
               uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18
               | (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 |
               (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
          ctx->H[uVar7][1] =
               uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18
               | (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
               (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
        }
        iVar1 = 0;
        for (uVar7 = 2; uVar7 < 0x10; uVar7 = uVar7 * 2) {
          uVar2 = (ulong)uVar7;
          pauVar3 = ctx->H + 1 + uVar2;
          pauVar4 = ctx->H + 1;
          for (uVar5 = 1; uVar5 != uVar2; uVar5 = uVar5 + 1) {
            for (uVar6 = 0; uVar6 < 9; uVar6 = uVar6 + 8) {
              *(ulong *)((long)*pauVar3 + uVar6) =
                   *(ulong *)((long)*pauVar4 + uVar6) ^ *(ulong *)((long)ctx->H[uVar2] + uVar6);
            }
            pauVar3 = pauVar3 + 1;
            pauVar4 = pauVar4 + 1;
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_gcm_setkey(mbedtls_gcm_context *ctx,
                       mbedtls_cipher_id_t cipher,
                       const unsigned char *key,
                       unsigned int keybits)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (keybits != 128 && keybits != 192 && keybits != 256) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

#if defined(MBEDTLS_BLOCK_CIPHER_C)
    mbedtls_block_cipher_free(&ctx->block_cipher_ctx);

    if ((ret = mbedtls_block_cipher_setup(&ctx->block_cipher_ctx, cipher)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_block_cipher_setkey(&ctx->block_cipher_ctx, key, keybits)) != 0) {
        return ret;
    }
#else
    const mbedtls_cipher_info_t *cipher_info;

    cipher_info = mbedtls_cipher_info_from_values(cipher, keybits,
                                                  MBEDTLS_MODE_ECB);
    if (cipher_info == NULL) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    if (mbedtls_cipher_info_get_block_size(cipher_info) != 16) {
        return MBEDTLS_ERR_GCM_BAD_INPUT;
    }

    mbedtls_cipher_free(&ctx->cipher_ctx);

    if ((ret = mbedtls_cipher_setup(&ctx->cipher_ctx, cipher_info)) != 0) {
        return ret;
    }

    if ((ret = mbedtls_cipher_setkey(&ctx->cipher_ctx, key, keybits,
                                     MBEDTLS_ENCRYPT)) != 0) {
        return ret;
    }
#endif

    if ((ret = gcm_gen_table(ctx)) != 0) {
        return ret;
    }

    return 0;
}